

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeasurementFactory.cpp
# Opt level: O1

Measurement * __thiscall
MeasurementFactory::CreateMeasurement
          (MeasurementFactory *this,Sensor *sensor,long timestamp,VectorXd *measurements)

{
  long lVar1;
  Measurement *this_00;
  
  if (sensor == (Sensor *)0x0) {
    this_00 = (Measurement *)0x0;
  }
  else {
    lVar1 = __dynamic_cast(sensor,&Sensor::typeinfo,&LidarSensor::typeinfo,0);
    if (lVar1 == 0) {
      this_00 = (Measurement *)0x0;
      lVar1 = __dynamic_cast(sensor,&Sensor::typeinfo,&RadarSensor::typeinfo,0);
      if (lVar1 != 0) {
        this_00 = (Measurement *)operator_new(0x50);
        RadarMeasurement::RadarMeasurement
                  ((RadarMeasurement *)this_00,sensor,timestamp,measurements);
      }
    }
    else {
      this_00 = (Measurement *)operator_new(0x50);
      LidarMeasurement::LidarMeasurement((LidarMeasurement *)this_00,sensor,timestamp,measurements);
    }
  }
  return this_00;
}

Assistant:

Measurement *MeasurementFactory::CreateMeasurement(const Sensor *sensor, long timestamp, VectorXd &measurements) {

    Measurement *m = 0; 

    if (dynamic_cast<const LidarSensor*>(sensor) != 0) {
        m = new LidarMeasurement(sensor, timestamp, measurements);
    } else if (dynamic_cast<const RadarSensor*>(sensor) != 0) {
        m = new RadarMeasurement(sensor, timestamp, measurements);
    }

    return m;
}